

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tiles.cpp
# Opt level: O2

bool __thiscall sfc::Tile::operator==(Tile *this,Tile *other)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  bool bVar2;
  index_vec_t *__x;
  long lVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__x_00;
  long lVar5;
  
  __x = &other->_data;
  bVar2 = std::operator==(__x,&this->_data);
  if (bVar2) {
    return true;
  }
  __x_00 = (this->_mirrors).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->_mirrors).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x_00 == pvVar1) {
    return false;
  }
  lVar5 = (long)pvVar1 - (long)__x_00;
  for (lVar3 = lVar5 / 0x18 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = std::operator==(__x_00,__x);
    pvVar4 = __x_00;
    if (bVar2) goto LAB_001463fe;
    bVar2 = std::operator==(__x_00 + 1,__x);
    pvVar4 = __x_00 + 1;
    if (bVar2) goto LAB_001463fe;
    bVar2 = std::operator==(__x_00 + 2,__x);
    pvVar4 = __x_00 + 2;
    if (bVar2) goto LAB_001463fe;
    bVar2 = std::operator==(__x_00 + 3,__x);
    pvVar4 = __x_00 + 3;
    if (bVar2) goto LAB_001463fe;
    __x_00 = __x_00 + 4;
    lVar5 = lVar5 + -0x60;
  }
  lVar5 = lVar5 / 0x18;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pvVar4 = pvVar1;
      if ((lVar5 != 3) || (bVar2 = std::operator==(__x_00,__x), pvVar4 = __x_00, bVar2))
      goto LAB_001463fe;
      __x_00 = __x_00 + 1;
    }
    bVar2 = std::operator==(__x_00,__x);
    pvVar4 = __x_00;
    if (bVar2) goto LAB_001463fe;
    __x_00 = __x_00 + 1;
  }
  bVar2 = std::operator==(__x_00,__x);
  pvVar4 = __x_00;
  if (!bVar2) {
    pvVar4 = pvVar1;
  }
LAB_001463fe:
  return pvVar4 != pvVar1;
}

Assistant:

bool Tile::operator==(const Tile& other) const {
  if (other._data == _data)
    return true;
  if (!_mirrors.empty()) {
    return std::any_of(_mirrors.begin(), _mirrors.end(), [&](const auto& m) { return m == other._data; });
  }
  return false;
}